

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitSetGlobal(WasmBytecodeGenerator *this)

{
  WasmType expectedType;
  uint uVar1;
  WasmBinaryReader *pWVar2;
  WasmGlobal *global;
  EmitInfo EVar3;
  EmitInfo local_30;
  EmitInfo info;
  
  pWVar2 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar2 == (WasmBinaryReader *)0x0) {
    pWVar2 = (this->m_module->m_reader).ptr;
  }
  global = Js::WebAssemblyModule::GetGlobal
                     (this->m_module,
                      (pWVar2->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets);
  uVar1 = Js::WebAssemblyModule::GetOffsetForGlobal(this->m_module,global);
  expectedType = global->m_type;
  local_30 = PopEvalStack(this,expectedType,(char16 *)0x0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,
             (ulong)EmitSetGlobal::globalOpcodes[(int)(expectedType - FirstLocalType)],
             (ulong)local_30 & 0xffffffff,1,(ulong)uVar1);
  ReleaseLocation(this,&local_30);
  EVar3.super_EmitInfoBase.location = 0xffffffff;
  EVar3.type = Void;
  return EVar3;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSetGlobal()
{
    uint32 globalIndex = GetReader()->m_currentNode.var.num;
    WasmGlobal* global = m_module->GetGlobal(globalIndex);
    Js::RegSlot slot = m_module->GetOffsetForGlobal(global);

    WasmTypes::WasmType type = global->GetType();
    EmitInfo info = PopEvalStack(type);

    CompileAssert(WasmTypes::I32 == 1);
    CompileAssert(WasmTypes::I64 == 2);
    CompileAssert(WasmTypes::F32 == 3);
    CompileAssert(WasmTypes::F64 == 4);
    static const Js::OpCodeAsmJs globalOpcodes[] = {
        Js::OpCodeAsmJs::StSlot_Int,
        Js::OpCodeAsmJs::StSlot_Long,
        Js::OpCodeAsmJs::StSlot_Flt,
        Js::OpCodeAsmJs::StSlot_Db
    };

    m_writer->AsmSlot(globalOpcodes[type - 1], info.location, WasmBytecodeGenerator::ModuleEnvRegister, slot);
    ReleaseLocation(&info);

    return EmitInfo();
}